

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O0

void extent_hook_post_reentrancy(tsdn_t *tsdn)

{
  tsd_t *in_RDI;
  long *in_FS_OFFSET;
  tsd_t *tsd;
  tsd_t *tsd_1;
  undefined8 in_stack_ffffffffffffffa8;
  tsd_t *in_stack_ffffffffffffffb0;
  
  if ((in_RDI == (tsd_t *)0x0) && (in_RDI = (tsd_t *)*in_FS_OFFSET, (in_RDI->state).repr != '\0')) {
    in_RDI = tsd_fetch_slow(in_stack_ffffffffffffffb0,
                            SUB81((ulong)in_stack_ffffffffffffffa8 >> 0x38,0));
  }
  post_reentrancy(in_RDI);
  return;
}

Assistant:

static void
extent_hook_post_reentrancy(tsdn_t *tsdn) {
	tsd_t *tsd = tsdn_null(tsdn) ? tsd_fetch() : tsdn_tsd(tsdn);
	post_reentrancy(tsd);
}